

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallExportGenerator::GenerateScriptActions
          (cmInstallExportGenerator *this,ostream *os,Indent indent)

{
  string *dest;
  cmScriptGeneratorIndent indent_00;
  cmScriptGeneratorIndent indent_01;
  cmScriptGeneratorIndent indent_02;
  ostream *poVar1;
  char local_e9;
  string installedFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string installedDir;
  cmAlphaNum local_60;
  
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0xd;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)anon_var_dwarf_12a5e0d;
  dest = &(this->super_cmInstallGenerator).Destination;
  cmInstallGenerator::ConvertToAbsoluteDestination(&installedFile,dest);
  local_60.View_._M_len = installedFile._M_string_length;
  local_60.View_._M_str = installedFile._M_dataplus._M_p;
  local_e9 = '/';
  cmStrCat<char>(&installedDir,(cmAlphaNum *)&files,&local_60,&local_e9);
  std::__cxx11::string::~string((string *)&installedFile);
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)installedDir._M_string_length;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)installedDir._M_dataplus._M_p;
  local_60.View_._M_str = (this->FileName)._M_dataplus._M_p;
  local_60.View_._M_len = (this->FileName)._M_string_length;
  cmStrCat<>(&installedFile,(cmAlphaNum *)&files,&local_60);
  poVar1 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  poVar1 = std::operator<<(poVar1,"if(EXISTS \"");
  poVar1 = std::operator<<(poVar1,(string *)&installedFile);
  std::operator<<(poVar1,"\")\n");
  indent_00.Level = indent.Level + 2;
  poVar1 = operator<<(os,indent_00);
  poVar1 = std::operator<<(poVar1,"file(DIFFERENT _cmake_export_file_changed FILES\n");
  poVar1 = operator<<(poVar1,indent_00);
  poVar1 = std::operator<<(poVar1,"     \"");
  poVar1 = std::operator<<(poVar1,(string *)&installedFile);
  poVar1 = std::operator<<(poVar1,"\"\n");
  poVar1 = operator<<(poVar1,indent_00);
  poVar1 = std::operator<<(poVar1,"     \"");
  poVar1 = std::operator<<(poVar1,(string *)&this->MainImportFile);
  std::operator<<(poVar1,"\")\n");
  poVar1 = operator<<(os,indent_00);
  std::operator<<(poVar1,"if(_cmake_export_file_changed)\n");
  indent_01.Level = indent.Level + 4;
  poVar1 = operator<<(os,indent_01);
  poVar1 = std::operator<<(poVar1,"file(GLOB _cmake_old_config_files \"");
  poVar1 = std::operator<<(poVar1,(string *)&installedDir);
  cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_
            ((string *)&files,
             (this->EFGen)._M_t.
             super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
             .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl);
  poVar1 = std::operator<<(poVar1,(string *)&files);
  std::operator<<(poVar1,"\")\n");
  std::__cxx11::string::~string((string *)&files);
  poVar1 = operator<<(os,indent_01);
  std::operator<<(poVar1,"if(_cmake_old_config_files)\n");
  indent_02.Level = indent.Level + 6;
  poVar1 = operator<<(os,indent_02);
  std::operator<<(poVar1,
                  "string(REPLACE \";\" \", \" _cmake_old_config_files_text \"${_cmake_old_config_files}\")\n"
                 );
  poVar1 = operator<<(os,indent_02);
  poVar1 = std::operator<<(poVar1,"message(STATUS \"Old export file \\\"");
  poVar1 = std::operator<<(poVar1,(string *)&installedFile);
  std::operator<<(poVar1,
                  "\\\" will be replaced.  Removing files [${_cmake_old_config_files_text}].\")\n");
  poVar1 = operator<<(os,indent_02);
  std::operator<<(poVar1,"unset(_cmake_old_config_files_text)\n");
  poVar1 = operator<<(os,indent_02);
  std::operator<<(poVar1,"file(REMOVE ${_cmake_old_config_files})\n");
  poVar1 = operator<<(os,indent_01);
  std::operator<<(poVar1,"endif()\n");
  poVar1 = operator<<(os,indent_01);
  std::operator<<(poVar1,"unset(_cmake_old_config_files)\n");
  poVar1 = operator<<(os,indent_00);
  std::operator<<(poVar1,"endif()\n");
  poVar1 = operator<<(os,indent_00);
  std::operator<<(poVar1,"unset(_cmake_export_file_changed)\n");
  poVar1 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
  std::operator<<(poVar1,"endif()\n");
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&files,&this->MainImportFile);
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,os,dest,cmInstallType_FILES,&files,false,
             (this->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,indent,
             (char *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  std::__cxx11::string::~string((string *)&installedFile);
  std::__cxx11::string::~string((string *)&installedDir);
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScriptActions(std::ostream& os,
                                                     Indent indent)
{
  // Remove old per-configuration export files if the main changes.
  std::string installedDir = cmStrCat(
    "$ENV{DESTDIR}", ConvertToAbsoluteDestination(this->Destination), '/');
  std::string installedFile = cmStrCat(installedDir, this->FileName);
  os << indent << "if(EXISTS \"" << installedFile << "\")\n";
  Indent indentN = indent.Next();
  Indent indentNN = indentN.Next();
  Indent indentNNN = indentNN.Next();
  /* clang-format off */
  os << indentN << "file(DIFFERENT _cmake_export_file_changed FILES\n"
     << indentN << "     \"" << installedFile << "\"\n"
     << indentN << "     \"" << this->MainImportFile << "\")\n";
  os << indentN << "if(_cmake_export_file_changed)\n";
  os << indentNN << "file(GLOB _cmake_old_config_files \"" << installedDir
     << this->EFGen->GetConfigImportFileGlob() << "\")\n";
  os << indentNN << "if(_cmake_old_config_files)\n";
  os << indentNNN << "string(REPLACE \";\" \", \" _cmake_old_config_files_text \"${_cmake_old_config_files}\")\n";
  os << indentNNN << R"(message(STATUS "Old export file \")" << installedFile
     << "\\\" will be replaced.  Removing files [${_cmake_old_config_files_text}].\")\n";
  os << indentNNN << "unset(_cmake_old_config_files_text)\n";
  os << indentNNN << "file(REMOVE ${_cmake_old_config_files})\n";
  os << indentNN << "endif()\n";
  os << indentNN << "unset(_cmake_old_config_files)\n";
  os << indentN << "endif()\n";
  os << indentN << "unset(_cmake_export_file_changed)\n";
  os << indent << "endif()\n";
  /* clang-format on */

  // Install the main export file.
  std::vector<std::string> files;
  files.push_back(this->MainImportFile);
  this->AddInstallRule(os, this->Destination, cmInstallType_FILES, files,
                       false, this->FilePermissions.c_str(), nullptr, nullptr,
                       nullptr, indent);
}